

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall
CConnman::ThreadOpenConnections
          (CConnman *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          connect,Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  seed_nodes)

{
  CThreadInterrupt *this_00;
  size_type *psVar1;
  ConnectionType CVar2;
  int iVar3;
  long lVar4;
  ServiceFlags SVar5;
  pointer pcVar6;
  CChainParams *pCVar7;
  byte *pbVar8;
  pointer ppCVar9;
  CNode *pCVar10;
  pointer pCVar11;
  AddrMan *pAVar12;
  double dVar13;
  long lVar14;
  undefined8 uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  uint16_t port;
  Network NVar23;
  int iVar24;
  time_point tVar25;
  uint64_t uVar26;
  size_t sVar27;
  long lVar28;
  Logger *pLVar29;
  size_type sVar30;
  const_iterator cVar31;
  time_point tVar32;
  duration rel_time;
  microseconds mVar33;
  long in_RCX;
  char *pcVar34;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *networks;
  ulong uVar35;
  pointer ppCVar36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar37;
  void *__stat_loc;
  uint uVar38;
  ulong uVar39;
  size_type *this_01;
  pointer pcVar40;
  iterator __first;
  int iVar41;
  string *strDest;
  pointer pCVar42;
  CAddress *this_02;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  undefined1 local_468 [16];
  uint local_458;
  ConnectionType local_440;
  int local_430;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  duration local_3f0;
  char *local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_370;
  undefined1 local_351;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_350;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_318;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  reachable_nets;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  fixed_seed_networks;
  optional<Network> preferred_net;
  CSemaphoreGrant grant;
  string local_278;
  vector<CAddress,_std::allocator<CAddress>_> seed_addrs;
  CService endpoint;
  NodeSeconds local_210;
  ServiceFlags SStack_208;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  outbound_ipv46_peer_netgroups;
  direct_or_indirect local_1c8;
  uint local_1b8;
  Network local_1b0;
  uint32_t uStack_1ac;
  uint16_t local_1a8;
  FastRandomContext rng;
  _Storage<Network,_true> local_118;
  undefined4 auStack_114 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  CAddress addrConnect;
  CAddress addr;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_88;
  
  pbVar37 = seed_nodes.m_data;
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rng,false);
  if ((pbVar37->_M_dataplus)._M_p == (pointer)pbVar37->_M_string_length) {
    tVar25 = NodeClock::now();
    lVar14 = (long)tVar25.__d.__r / 1000;
    uVar26 = FastRandomContext::rand64(&rng);
    dVar13 = MakeExponentiallyDistributed(uVar26);
    local_468._0_10_ = (unkbyte10)0.5;
    local_408 = (long)ROUND((longdouble)local_468._0_10_ + (longdouble)(dVar13 * 120000000.0)) +
                lVar14;
    uVar26 = FastRandomContext::rand64(&rng);
    dVar13 = MakeExponentiallyDistributed(uVar26);
    local_400 = (long)ROUND((longdouble)local_468._0_10_ + (longdouble)(dVar13 * 300000000.0)) +
                lVar14;
    uVar26 = FastRandomContext::rand64(&rng);
    dVar13 = MakeExponentiallyDistributed(uVar26);
    local_410 = (long)ROUND((longdouble)local_468._0_10_ + (longdouble)(dVar13 * 300000000.0)) +
                lVar14;
    psVar1 = &addr.super_CService.super_CNetAddr.m_addr._size;
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"-dnsseed","");
    bVar16 = ArgsManager::GetBoolArg(&gArgs,(string *)&addr,true);
    if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
        psVar1) {
      operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                      CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                               addr.super_CService.super_CNetAddr.m_addr._size) + 1);
    }
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"-fixedseeds","");
    bVar17 = ArgsManager::GetBoolArg(&gArgs,(string *)&addr,true);
    if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
        psVar1) {
      operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                      CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                               addr.super_CService.super_CNetAddr.m_addr._size) + 1);
    }
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"-seednode","");
    bVar18 = ArgsManager::IsArgSet(&gArgs,(string *)&addr);
    if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
        psVar1) {
      operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                      CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                               addr.super_CService.super_CNetAddr.m_addr._size) + 1);
    }
    local_3f0.__r = (rep)NodeClock::now();
    sVar27 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    if (!bVar17) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "ThreadOpenConnections";
      logging_function._M_len = 0x15;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x9c2,ALL,Info,(ConstevalFormatString<0U>)0xf9bf52);
    }
    bVar19 = sVar27 == 0 && in_RCX != 0;
    this_00 = &this->interruptNet;
    local_418 = in_RCX;
    do {
      bVar20 = CThreadInterrupt::operator_cast_to_bool(this_00);
      if (bVar20) break;
      if (bVar19) {
        local_418 = local_418 + -1;
        strDest = (string *)(local_418 * 0x20 + seed_nodes.m_size);
        AddAddrFetch(this,strDest);
        sVar27 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
        if (sVar27 == 0) {
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_01._M_len = 0x57;
          logging_function_01._M_str = "ThreadOpenConnections";
          logging_function_01._M_len = 0x15;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_01,source_file_01,0x9cd,ALL,Info,
                     (ConstevalFormatString<1U>)0xf9bf6c,strDest);
        }
        else {
          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0xa;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_00._M_len = 0x57;
          logging_function_00._M_str = "ThreadOpenConnections";
          logging_function_00._M_len = 0x15;
          LogPrintFormatInternal<long,std::__cxx11::string>
                    (logging_function_00,source_file_00,0x9cf,ALL,Info,
                     (ConstevalFormatString<2U>)0xf9bf9e,(long *)&addr,strDest);
        }
        bVar19 = false;
      }
      ProcessAddrFetch(this);
      __stat_loc = (void *)0x1dcd6500;
      bVar20 = CThreadInterrupt::sleep_for(this_00,(duration)0x1dcd6500);
      if (!bVar20) break;
      PerformReconnections(this);
      grant.sem = (this->semOutbound)._M_t.
                  super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                  super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                  super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
      grant.fHaveGrant = false;
      CSemaphore::wait(grant.sem,__stat_loc);
      grant.fHaveGrant = true;
      bVar20 = CThreadInterrupt::operator_cast_to_bool(this_00);
      iVar24 = 1;
      if (!bVar20) {
        GetReachableEmptyNetworks(&fixed_seed_networks,this);
        if ((bVar17 != false) && (fixed_seed_networks._M_h._M_element_count != 0)) {
          tVar25 = NodeClock::now();
          lVar28 = ((long)tVar25.__d.__r / 1000000000) * 1000000;
          if (lVar28 - (lVar14 + 60000000) == 0 || lVar28 < lVar14 + 60000000) {
            if (!bVar16 && !bVar18) {
              addr.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
              addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   (char *)&this->m_added_nodes_mutex;
              std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&addr);
              if ((this->m_added_node_params).
                  super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  (this->m_added_node_params).
                  super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                source_file_04._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file_04._M_len = 0x57;
                pcVar34 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                logging_function_04._M_str = "ThreadOpenConnections";
                logging_function_04._M_len = 0x15;
                LogPrintFormatInternal<>
                          (logging_function_04,source_file_04,0x9f0,ALL,Info,
                           (ConstevalFormatString<0U>)0xf9c060);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
                goto LAB_008d216a;
              }
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
            }
          }
          else {
            source_file_02._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_02._M_len = 0x57;
            pcVar34 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            logging_function_02._M_str = "ThreadOpenConnections";
            logging_function_02._M_len = 0x15;
            LogPrintFormatInternal<>
                      (logging_function_02,source_file_02,0x9e8,ALL,Info,
                       (ConstevalFormatString<0U>)0xf9bffa);
LAB_008d216a:
            this_01 = &reachable_nets._M_h._M_bucket_count;
            pCVar7 = this->m_params;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            FastRandomContext::FastRandomContext((FastRandomContext *)&addr,false);
            pbVar8 = (pCVar7->vFixedSeeds).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sp.m_size = (long)(pCVar7->vFixedSeeds).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
            sp.m_data = pbVar8;
            DataStream::DataStream((DataStream *)&addrConnect,sp);
            reachable_nets._M_h._M_buckets = (__buckets_ptr)&CAddress::V2_NETWORK;
            reachable_nets._M_h._M_bucket_count =
                 (size_type)
                 addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
            reachable_nets._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_;
            reachable_nets._M_h._M_element_count =
                 addrConnect.super_CService.super_CNetAddr.m_addr._16_8_;
            reachable_nets._M_h._M_rehash_policy._M_max_load_factor =
                 (float)addrConnect.super_CService.super_CNetAddr.m_net;
            reachable_nets._M_h._M_rehash_policy._4_4_ =
                 addrConnect.super_CService.super_CNetAddr.m_scope_id;
            addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                 (char *)0x0;
            addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
            addrConnect.super_CService.super_CNetAddr.m_addr._size = 0;
            addrConnect.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                       &addrConnect);
            while ((_Hash_node_base *)
                   (reachable_nets._M_h._M_rehash_policy._0_8_ + reachable_nets._M_h._M_bucket_count
                   ) != reachable_nets._M_h._M_before_begin._M_nxt) {
              CService::CService(&endpoint);
              CNetAddr::Unserialize<ParamsStream<DataStream,CAddress::SerParams>>
                        (&endpoint.super_CNetAddr,
                         (ParamsStream<DataStream,_CAddress::SerParams> *)&reachable_nets);
              addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   (char *)0x0;
              DataStream::read((DataStream *)this_01,
                               (int)&addrConnect.super_CService.super_CNetAddr.m_addr._union + 6,
                               (void *)0x2,(size_t)pcVar34);
              endpoint.port =
                   (ushort)(byte)((ulong)addrConnect.super_CService.super_CNetAddr.m_addr._union.
                                         _0_8_ >> 0x38) |
                   (ushort)((ulong)addrConnect.super_CService.super_CNetAddr.m_addr._union._0_8_ >>
                           0x28) & 0xff00;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &outbound_ipv46_peer_netgroups,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&endpoint);
              outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)endpoint.super_CNetAddr._24_8_;
              outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)
                   CONCAT62(outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_right._2_6_,endpoint.port);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrConnect,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &outbound_ipv46_peer_netgroups);
              addrConnect.super_CService.super_CNetAddr._24_8_ =
                   outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
              addrConnect.super_CService.port =
                   (uint16_t)
                   outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_right;
              addrConnect.nTime.__d.__r = (duration)100000000;
              addrConnect.nServices = NODE_WITNESS|NODE_NETWORK;
              if (0x10 < (uint)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent) {
                free((void *)outbound_ipv46_peer_netgroups._M_t._M_impl._0_8_);
                outbound_ipv46_peer_netgroups._M_t._M_impl._0_8_ = 0;
              }
              tVar25 = NodeClock::now();
              pcVar34 = (char *)0x112e0be826d694b3;
              do {
                uVar26 = RandomMixin<FastRandomContext>::randbits
                                   ((RandomMixin<FastRandomContext> *)&addr,0x14);
              } while (0x93a7f < uVar26);
              addrConnect.nTime.__d.__r =
                   (duration)(((long)tVar25.__d.__r / 1000000000 - uVar26) + -0x93a80);
              pLVar29 = LogInstance();
              bVar17 = BCLog::Logger::WillLogCategoryLevel(pLVar29,NET,Debug);
              if (bVar17) {
                CService::ToStringAddrPort_abi_cxx11_
                          ((string *)&local_118,&addrConnect.super_CService);
                source_file_03._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file_03._M_len = 0x57;
                pcVar34 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                logging_function_03._M_str = "ConvertSeeds";
                logging_function_03._M_len = 0xc;
                LogPrintFormatInternal<std::__cxx11::string>
                          (logging_function_03,source_file_03,0xcf,NET,Debug,
                           (ConstevalFormatString<1U>)0xf9c854,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_118);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(auStack_114[0],local_118._M_value) != &local_108) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(auStack_114[0],local_118._M_value),
                                  local_108._M_allocated_capacity + 1);
                }
              }
              std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&seed_addrs,&addrConnect);
              if (0x10 < addrConnect.super_CService.super_CNetAddr.m_addr._size) {
                free(addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                     indirect);
                addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              if (0x10 < endpoint.super_CNetAddr.m_addr._size) {
                free(endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect);
                endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
              }
            }
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)this_01);
            ChaCha20::~ChaCha20((ChaCha20 *)&addr.super_CService.super_CNetAddr.m_addr._size);
            pCVar11 = seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            lVar28 = ((long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 >> 2
            ;
            pCVar42 = seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (0 < lVar28) {
              lVar28 = lVar28 + 1;
              do {
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)pCVar42);
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                __first._M_current = pCVar42;
                if (sVar30 == 0) goto LAB_008d270c;
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)(pCVar42 + 1));
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                __first._M_current = pCVar42 + 1;
                if (sVar30 == 0) goto LAB_008d270c;
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)(pCVar42 + 2));
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                __first._M_current = pCVar42 + 2;
                if (sVar30 == 0) goto LAB_008d270c;
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)(pCVar42 + 3));
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                __first._M_current = pCVar42 + 3;
                if (sVar30 == 0) goto LAB_008d270c;
                pCVar42 = pCVar42 + 4;
                lVar28 = lVar28 + -1;
              } while (1 < lVar28);
            }
            lVar28 = ((long)pCVar11 - (long)pCVar42 >> 3) * 0x6db6db6db6db6db7;
            if (lVar28 == 1) {
LAB_008d26e3:
              NVar23 = CNetAddr::GetNetwork((CNetAddr *)pCVar42);
              addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
              sVar30 = std::
                       _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
              __first._M_current = pCVar42;
              if (sVar30 != 0) {
                __first._M_current = pCVar11;
              }
            }
            else if (lVar28 == 2) {
LAB_008d26b1:
              NVar23 = CNetAddr::GetNetwork((CNetAddr *)pCVar42);
              addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
              sVar30 = std::
                       _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
              __first._M_current = pCVar42;
              if (sVar30 != 0) {
                pCVar42 = pCVar42 + 1;
                goto LAB_008d26e3;
              }
            }
            else {
              __first._M_current = pCVar11;
              if (lVar28 == 3) {
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)pCVar42);
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                __first._M_current = pCVar42;
                if (sVar30 != 0) {
                  pCVar42 = pCVar42 + 1;
                  goto LAB_008d26b1;
                }
              }
            }
LAB_008d270c:
            this_02 = __first._M_current + 1;
            if (this_02 != pCVar11 && __first._M_current != pCVar11) {
              do {
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)this_02);
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                if (sVar30 != 0) {
                  if (0x10 < *(uint *)((direct_or_indirect *)
                                       &((__first._M_current)->super_CService).super_CNetAddr + 1))
                  {
                    free((((direct_or_indirect *)
                          &((__first._M_current)->super_CService).super_CNetAddr)->indirect_contents
                         ).indirect);
                  }
                  uVar15 = *(undefined8 *)
                            ((long)&(this_02->super_CService).super_CNetAddr.m_addr._union + 8);
                  (((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr)->
                  indirect_contents).indirect =
                       (this_02->super_CService).super_CNetAddr.m_addr._union.indirect_contents.
                       indirect;
                  *(undefined8 *)((long)&((__first._M_current)->super_CService).super_CNetAddr + 8)
                       = uVar15;
                  *(size_type *)
                   ((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr + 1
                   ) = (this_02->super_CService).super_CNetAddr.m_addr._size;
                  (this_02->super_CService).super_CNetAddr.m_addr._size = 0;
                  *(undefined8 *)
                   (((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr)->
                    direct + 0x18) = *(undefined8 *)&(this_02->super_CService).super_CNetAddr.m_net;
                  ((__first._M_current)->super_CService).port = (this_02->super_CService).port;
                  SVar5 = this_02->nServices;
                  ((__first._M_current)->nTime).__d.__r = (this_02->nTime).__d.__r;
                  (__first._M_current)->nServices = SVar5;
                  __first._M_current = __first._M_current + 1;
                }
                this_02 = this_02 + 1;
              } while (this_02 != pCVar11);
            }
            std::vector<CAddress,_std::allocator<CAddress>_>::_M_erase
                      (&seed_addrs,__first,
                       (iterator)
                       seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            CNetAddr::CNetAddr((CNetAddr *)&addr);
            addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                 (char *)&addrConnect.super_CService.super_CNetAddr.m_addr._size;
            std::__cxx11::string::_M_construct<char_const*>((string *)&addrConnect,"fixedseeds","");
            CNetAddr::SetInternal((CNetAddr *)&addr,(string *)&addrConnect);
            if ((size_type *)
                addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
                != &addrConnect.super_CService.super_CNetAddr.m_addr._size) {
              operator_delete(addrConnect.super_CService.super_CNetAddr.m_addr._union.
                              indirect_contents.indirect,
                              addrConnect.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
            }
            AddrMan::Add(this->addrman,&seed_addrs,(CNetAddr *)&addr,(seconds)0x0);
            addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                 (char *)(((long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7
                         );
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_05._M_len = 0x57;
            logging_function_05._M_str = "ThreadOpenConnections";
            logging_function_05._M_len = 0x15;
            LogPrintFormatInternal<unsigned_long>
                      (logging_function_05,source_file_05,0xa03,ALL,Info,
                       (ConstevalFormatString<1U>)0xf9c0e7,(unsigned_long *)&addrConnect);
            if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
              free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   (char *)0x0;
            }
            std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&seed_addrs);
            bVar17 = false;
          }
        }
        CService::CService(&addrConnect.super_CService);
        addrConnect.nTime.__d.__r = (duration)100000000;
        addrConnect.nServices = NODE_NONE;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
        ;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        endpoint.super_CNetAddr.m_addr._union._8_8_ =
             endpoint.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
        endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect =
             (char *)&this->m_nodes_mutex;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&endpoint)
        ;
        ppCVar36 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar9 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar36 == ppCVar9) {
          local_430 = 0;
          iVar41 = 0;
          uVar38 = 0;
        }
        else {
          uVar38 = 0;
          iVar41 = 0;
          local_430 = 0;
          do {
            pCVar10 = *ppCVar36;
            CVar2 = pCVar10->m_conn_type;
            local_468[0] = CVar2 == BLOCK_RELAY;
            if ((CVar2 < ADDR_FETCH) && ((0x16U >> (CVar2 & 0x1f) & 1) != 0)) {
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&pCVar10->addr);
              addr.super_CService.super_CNetAddr.m_net =
                   (pCVar10->addr).super_CService.super_CNetAddr.m_net;
              addr.super_CService.super_CNetAddr.m_scope_id =
                   (pCVar10->addr).super_CService.super_CNetAddr.m_scope_id;
              addr.super_CService.port = (pCVar10->addr).super_CService.port;
              addr.nTime.__d.__r = (duration)(pCVar10->addr).nTime.__d.__r;
              addr.nServices = (pCVar10->addr).nServices;
              if (addr.super_CService.super_CNetAddr.m_net - NET_ONION < 3) {
                local_430 = local_430 + 1;
              }
              else {
                NetGroupManager::GetGroup
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&reachable_nets,
                           this->m_netgroupman,(CNetAddr *)&addr);
                std::
                _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ::_M_insert_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            *)&outbound_ipv46_peer_netgroups,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&reachable_nets)
                ;
                if (reachable_nets._M_h._M_buckets != (__buckets_ptr)0x0) {
                  operator_delete(reachable_nets._M_h._M_buckets,
                                  (long)reachable_nets._M_h._M_before_begin._M_nxt -
                                  (long)reachable_nets._M_h._M_buckets);
                }
              }
              if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
                free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
                addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
            }
            uVar38 = uVar38 + (CVar2 == OUTBOUND_FULL_RELAY);
            iVar41 = iVar41 + (uint)(CVar2 == BLOCK_RELAY);
            ppCVar36 = ppCVar36 + 1;
          } while (ppCVar36 != ppCVar9);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&endpoint);
        if (((local_418 != 0) && (uVar38 < 2)) &&
           (tVar25 = NodeClock::now(), local_3f0.__r + 10000000000 < (long)tVar25.__d.__r)) {
          bVar19 = true;
          local_3f0.__r = (rep)NodeClock::now();
        }
        tVar25 = NodeClock::now();
        preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
        super__Optional_payload_base<Network>._M_engaged = false;
        bVar20 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar3 = this->m_max_outbound_block_relay;
        if (iVar3 > iVar41 && !bVar20) {
LAB_008d2b66:
          local_440 = BLOCK_RELAY;
          local_468._0_10_ = (unkuint10)(uint6)local_468._4_6_ << 0x20;
          goto LAB_008d2b8d;
        }
        if ((int)uVar38 < this->m_max_outbound_full_relay) {
LAB_008d2b7d:
          local_468._0_10_ = (unkuint10)(uint6)local_468._4_6_ << 0x20;
          local_440 = OUTBOUND_FULL_RELAY;
          goto LAB_008d2b8d;
        }
        local_440 = BLOCK_RELAY;
        if (iVar41 < iVar3) goto LAB_008d2b66;
        if (((this->m_try_another_outbound_peer)._M_base._M_i & 1U) != 0) goto LAB_008d2b7d;
        lVar28 = (long)tVar25.__d.__r / 1000;
        if ((local_400 < lVar28) &&
           (((this->m_start_extra_block_relay_peers)._M_base._M_i & 1U) != 0)) {
          uVar26 = FastRandomContext::rand64(&rng);
          dVar13 = MakeExponentiallyDistributed(uVar26);
          local_400 = lVar28 + (long)ROUND(dVar13 * 300000000.0 + 0.5);
          local_468._0_10_ = (unkuint10)(uint6)local_468._4_6_ << 0x20;
LAB_008d2b8d:
          AddrMan::ResolveCollisions(this->addrman);
          tVar25 = NodeClock::now();
          ReachableNets::All(&reachable_nets,&g_reachable_nets);
          local_458 = 0;
          do {
            while( true ) {
              bVar21 = CThreadInterrupt::operator_cast_to_bool(this_00);
              if (bVar21) goto LAB_008d3521;
              if ((iVar3 <= iVar41 || bVar20) ||
                 (pCVar11 = (this->m_anchors).
                            super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                            super__Vector_impl_data._M_finish,
                 (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start == pCVar11)) break;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)(pCVar11 + -1));
              addr.super_CService.super_CNetAddr.m_net =
                   pCVar11[-1].super_CService.super_CNetAddr.m_net;
              addr.super_CService.super_CNetAddr.m_scope_id =
                   pCVar11[-1].super_CService.super_CNetAddr.m_scope_id;
              addr.super_CService.port = pCVar11[-1].super_CService.port;
              addr.nTime.__d.__r = (duration)pCVar11[-1].nTime.__d.__r;
              addr.nServices = pCVar11[-1].nServices;
              pCVar42 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pCVar11 = pCVar42 + -1;
              (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_finish = pCVar11;
              if (0x10 < pCVar42[-1].super_CService.super_CNetAddr.m_addr._size) {
                free((pCVar11->super_CService).super_CNetAddr.m_addr._union.indirect_contents.
                     indirect);
                (pCVar11->super_CService).super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              bVar22 = CNetAddr::IsValid((CNetAddr *)&addr);
              bVar21 = true;
              if ((!bVar22) || (bVar22 = IsLocal(&addr.super_CService), bVar22)) {
LAB_008d2cf6:
                bVar22 = false;
              }
              else {
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)&addr);
                bVar22 = ReachableNets::Contains(&g_reachable_nets,NVar23);
                if ((!bVar22) ||
                   (iVar24 = (*this->m_msgproc->_vptr_NetEventsInterface[2])
                                       (this->m_msgproc,addr.nServices), (char)iVar24 == '\0'))
                goto LAB_008d2cf6;
                NetGroupManager::GetGroup(&local_318,this->m_netgroupman,(CNetAddr *)&addr);
                cVar31 = std::
                         _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::find(&outbound_ipv46_peer_netgroups._M_t,&local_318);
                bVar21 = (_Rb_tree_header *)cVar31._M_node !=
                         &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header;
                bVar22 = true;
              }
              if ((bVar22) &&
                 (local_318.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                operator_delete(local_318.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_318.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_318.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (!bVar21) {
                prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                          ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrConnect,
                           (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
                addrConnect.super_CService.super_CNetAddr.m_net =
                     addr.super_CService.super_CNetAddr.m_net;
                addrConnect.super_CService.super_CNetAddr.m_scope_id =
                     addr.super_CService.super_CNetAddr.m_scope_id;
                addrConnect.super_CService.port = addr.super_CService.port;
                addrConnect.nTime = addr.nTime;
                addrConnect.nServices = addr.nServices;
                pLVar29 = LogInstance();
                bVar22 = BCLog::Logger::WillLogCategoryLevel(pLVar29,NET,Debug);
                if (bVar22) {
                  CService::ToStringAddrPort_abi_cxx11_
                            ((string *)&endpoint,&addrConnect.super_CService);
                  source_file_06._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ;
                  source_file_06._M_len = 0x57;
                  logging_function_06._M_str = "ThreadOpenConnections";
                  logging_function_06._M_len = 0x15;
                  LogPrintFormatInternal<std::__cxx11::string>
                            (logging_function_06,source_file_06,0xa93,NET,Debug,
                             (ConstevalFormatString<1U>)0xf9c116,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &endpoint);
                  if ((size_type *)endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect
                      != &endpoint.super_CNetAddr.m_addr._size) {
                    operator_delete(endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect
                                    ,CONCAT44(endpoint.super_CNetAddr.m_addr._20_4_,
                                              endpoint.super_CNetAddr.m_addr._size) + 1);
                  }
                }
              }
              if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
                free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
                addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              if (!bVar21) goto LAB_008d3521;
            }
            if (local_458 == 100) break;
            CService::CService(&endpoint);
            bVar21 = preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                     super__Optional_payload_base<Network>._M_engaged;
            if (local_468[0] == '\0') {
              pAVar12 = this->addrman;
              networks = &reachable_nets._M_h;
              if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                  super__Optional_payload_base<Network>._M_engaged == true) {
                local_118 = preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                            super__Optional_payload_base<Network>._M_payload;
                networks = &local_350;
                std::
                _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::_Hashtable<Network_const*>
                          ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)networks,&local_118,auStack_114,0,&seed_addrs,&local_378,&local_351);
              }
              AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                               *)&addr,pAVar12,false,
                              (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                               *)networks);
              if (0x10 < endpoint.super_CNetAddr.m_addr._size) {
                free(endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              }
              endpoint.super_CNetAddr.m_addr._union._8_8_ =
                   CONCAT71(addr.super_CService.super_CNetAddr.m_addr._union._9_7_,
                            addr.super_CService.super_CNetAddr.m_addr._union.direct[8]);
              endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
              endpoint.super_CNetAddr.m_addr._size = addr.super_CService.super_CNetAddr.m_addr._size
              ;
              addr.super_CService.super_CNetAddr.m_addr._size = 0;
              endpoint.super_CNetAddr.m_net = addr.super_CService.super_CNetAddr.m_net;
              endpoint.super_CNetAddr.m_scope_id = addr.super_CService.super_CNetAddr.m_scope_id;
              endpoint.port = addr.super_CService.port;
              local_210 = (NodeSeconds)(NodeSeconds)addr.nTime.__d.__r;
              SStack_208 = addr.nServices;
              if (bVar21 != false) {
                std::
                _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable(&local_350);
              }
            }
            else {
              AddrMan::SelectTriedCollision
                        ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                          *)&addr,this->addrman);
              if (0x10 < endpoint.super_CNetAddr.m_addr._size) {
                free(endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              }
              endpoint.super_CNetAddr.m_addr._union._8_8_ =
                   CONCAT71(addr.super_CService.super_CNetAddr.m_addr._union._9_7_,
                            addr.super_CService.super_CNetAddr.m_addr._union.direct[8]);
              endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
              endpoint.super_CNetAddr.m_addr._size = addr.super_CService.super_CNetAddr.m_addr._size
              ;
              addr.super_CService.super_CNetAddr.m_addr._size = 0;
              endpoint.super_CNetAddr.m_net = addr.super_CService.super_CNetAddr.m_net;
              endpoint.super_CNetAddr.m_scope_id = addr.super_CService.super_CNetAddr.m_scope_id;
              endpoint.port = addr.super_CService.port;
              local_210 = (NodeSeconds)(NodeSeconds)addr.nTime.__d.__r;
              SStack_208 = addr.nServices;
              bVar21 = CNetAddr::IsValid(&endpoint.super_CNetAddr);
              if (bVar21) {
                bVar21 = AlreadyConnectedToAddress(this,(CAddress *)&endpoint);
                if (!bVar21) goto LAB_008d3158;
                pAVar12 = this->addrman;
                tVar32 = NodeClock::now();
                AddrMan::Good(pAVar12,&endpoint,(NodeSeconds)((long)tVar32.__d.__r / 1000000000));
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&addr,this->addrman,true,&reachable_nets);
              }
              else {
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&addr,this->addrman,true,&reachable_nets);
              }
              if (0x10 < endpoint.super_CNetAddr.m_addr._size) {
                free(endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              }
              endpoint.super_CNetAddr.m_addr._union._8_8_ =
                   CONCAT71(addr.super_CService.super_CNetAddr.m_addr._union._9_7_,
                            addr.super_CService.super_CNetAddr.m_addr._union.direct[8]);
              endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
              endpoint.super_CNetAddr.m_addr._size = addr.super_CService.super_CNetAddr.m_addr._size
              ;
              addr.super_CService.super_CNetAddr.m_addr._size = 0;
              endpoint.super_CNetAddr.m_net = addr.super_CService.super_CNetAddr.m_net;
              endpoint.super_CNetAddr.m_scope_id = addr.super_CService.super_CNetAddr.m_scope_id;
              endpoint.port = addr.super_CService.port;
              local_210 = (NodeSeconds)(NodeSeconds)addr.nTime.__d.__r;
              SStack_208 = addr.nServices;
            }
LAB_008d3158:
            if (local_468[0] == '\0') {
              NetGroupManager::GetGroup(&local_370,this->m_netgroupman,&endpoint.super_CNetAddr);
              cVar31 = std::
                       _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::find(&outbound_ipv46_peer_netgroups._M_t,&local_370);
              bVar21 = (_Rb_tree_header *)cVar31._M_node !=
                       &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header;
              if (local_370.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_370.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_370.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_370.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              bVar21 = false;
            }
            bVar22 = true;
            if (!bVar21) {
              bVar21 = CNetAddr::IsValid(&endpoint.super_CNetAddr);
              if ((!bVar21) || (bVar21 = IsLocal(&endpoint), bVar21)) {
LAB_008d31ed:
                bVar22 = false;
              }
              else {
                NVar23 = CNetAddr::GetNetwork(&endpoint.super_CNetAddr);
                bVar21 = ReachableNets::Contains(&g_reachable_nets,NVar23);
                if ((bVar21) &&
                   (599999999999 < (long)local_88.__d.__r * -1000000000 + (long)tVar25.__d.__r ||
                    0x1c < local_458)) {
                  if (local_468[0] == '\0') {
                    iVar24 = (*this->m_msgproc->_vptr_NetEventsInterface[2])
                                       (this->m_msgproc,SStack_208);
                    if ((char)iVar24 != '\0') goto LAB_008d32ae;
                  }
                  else if ((SStack_208 & (NODE_NETWORK_LIMITED|NODE_NETWORK)) != NODE_NONE) {
LAB_008d32ae:
                    if ((local_458 < 0x31) && (endpoint.super_CNetAddr.m_net - NET_IPV4 < 2)) {
                      port = CService::GetPort(&endpoint);
                      bVar21 = IsBadPort(port);
                      if (bVar21) goto LAB_008d31f0;
                    }
                    bVar21 = AddedNodesContain(this,(CAddress *)&endpoint);
                    if (!bVar21) {
                      prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrConnect,
                                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&endpoint);
                      addrConnect.super_CService.super_CNetAddr.m_net =
                           endpoint.super_CNetAddr.m_net;
                      addrConnect.super_CService.super_CNetAddr.m_scope_id =
                           endpoint.super_CNetAddr.m_scope_id;
                      addrConnect.super_CService.port = endpoint.port;
                      addrConnect.nTime.__d.__r = local_210.__d.__r;
                      addrConnect.nServices = SStack_208;
                      goto LAB_008d31ed;
                    }
                    pLVar29 = LogInstance();
                    bVar21 = BCLog::Logger::WillLogCategoryLevel(pLVar29,NET,Debug);
                    if (bVar21) {
                      local_378 = "";
                      pcVar34 = "network-specific ";
                      if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                          super__Optional_payload_base<Network>._M_engaged != false) {
                        local_378 = "network-specific ";
                      }
                      ConnectionTypeAsString_abi_cxx11_((string *)&addr,local_440);
                      NVar23 = CNetAddr::GetNetwork(&endpoint.super_CNetAddr);
                      GetNetworkName_abi_cxx11_((string *)&local_118,NVar23);
                      bVar21 = fLogIPs;
                      if (fLogIPs == true) {
                        CService::ToStringAddrPort_abi_cxx11_(&local_278,&endpoint);
                        tinyformat::format<std::__cxx11::string>
                                  ((string *)&seed_addrs,(tinyformat *)0xf9992c,(char *)&local_278,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pcVar34);
                      }
                      else {
                        seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_start =
                             (pointer)&seed_addrs.
                                       super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&seed_addrs,"");
                      }
                      source_file_07._M_str =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                      ;
                      source_file_07._M_len = 0x57;
                      logging_function_07._M_str = "ThreadOpenConnections";
                      logging_function_07._M_len = 0x15;
                      LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                (logging_function_07,source_file_07,0xae6,NET,Debug,
                                 (ConstevalFormatString<4U>)0xf9c141,&local_378,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&addr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&local_118,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&seed_addrs);
                      if (seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                          .super__Vector_impl_data._M_start !=
                          (pointer)&seed_addrs.
                                    super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(seed_addrs.
                                        super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)&((seed_addrs.
                                                                                                                  
                                                  super__Vector_base<CAddress,_std::allocator<CAddress>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->super_CService).super_CNetAddr.m_addr._union +
                                               1));
                      }
                      if ((bVar21 != false) &&
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_278._M_dataplus._M_p != &local_278.field_2)) {
                        operator_delete(local_278._M_dataplus._M_p,
                                        local_278.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(auStack_114[0],local_118._M_value) != &local_108) {
                        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT44(auStack_114[0],local_118._M_value),
                                        local_108._M_allocated_capacity + 1);
                      }
                      if ((size_type *)
                          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                          indirect != &addr.super_CService.super_CNetAddr.m_addr._size) {
                        operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.
                                        indirect_contents.indirect,
                                        CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                                                 addr.super_CService.super_CNetAddr.m_addr._size) +
                                        1);
                      }
                    }
                  }
                }
              }
            }
LAB_008d31f0:
            if (0x10 < endpoint.super_CNetAddr.m_addr._size) {
              free(endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
            }
            local_458 = local_458 + 1;
          } while (bVar22);
LAB_008d3521:
          bVar20 = CNetAddr::IsValid((CNetAddr *)&addrConnect);
          iVar24 = 0;
          if (bVar20) {
            if (local_468[0] != '\0') {
              rel_time = RandomMixin<FastRandomContext>::
                         rand_uniform_duration<std::chrono::_V2::steady_clock>
                                   (&rng.super_RandomMixin<FastRandomContext>,(duration)0x3b9aca00);
              bVar20 = CThreadInterrupt::sleep_for(this_00,rel_time);
              iVar24 = 1;
              if (!bVar20) goto LAB_008d3759;
              pLVar29 = LogInstance();
              bVar20 = BCLog::Logger::WillLogCategoryLevel(pLVar29,NET,Debug);
              if (bVar20) {
                CService::ToStringAddrPort_abi_cxx11_((string *)&addr,&addrConnect.super_CService);
                source_file_08._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file_08._M_len = 0x57;
                logging_function_08._M_str = "ThreadOpenConnections";
                logging_function_08._M_len = 0x15;
                LogPrintFormatInternal<std::__cxx11::string>
                          (logging_function_08,source_file_08,0xaf4,NET,Debug,
                           (ConstevalFormatString<1U>)0xf9c1af,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &addr);
                if ((size_type *)
                    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
                    &addr.super_CService.super_CNetAddr.m_addr._size) {
                  operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents
                                  .indirect,
                                  CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                                           addr.super_CService.super_CNetAddr.m_addr._size) + 1);
                }
              }
            }
            if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                super__Optional_payload_base<Network>._M_engaged == true) {
              pLVar29 = LogInstance();
              bVar20 = BCLog::Logger::WillLogCategoryLevel(pLVar29,NET,Debug);
              if (bVar20) {
                CService::ToStringAddrPort_abi_cxx11_((string *)&addr,&addrConnect.super_CService);
                GetNetworkName_abi_cxx11_
                          ((string *)&endpoint,
                           preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                           super__Optional_payload_base<Network>._M_payload._M_value);
                source_file_09._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file_09._M_len = 0x57;
                logging_function_09._M_str = "ThreadOpenConnections";
                logging_function_09._M_len = 0x15;
                LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                          (logging_function_09,source_file_09,0xaf7,NET,Debug,
                           (ConstevalFormatString<2U>)0xf9c1cf,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &addr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&endpoint);
                if ((size_type *)endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
                    &endpoint.super_CNetAddr.m_addr._size) {
                  operator_delete(endpoint.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                                  CONCAT44(endpoint.super_CNetAddr.m_addr._20_4_,
                                           endpoint.super_CNetAddr.m_addr._size) + 1);
                }
                if ((size_type *)
                    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
                    &addr.super_CService.super_CNetAddr.m_addr._size) {
                  operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents
                                  .indirect,
                                  CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                                           addr.super_CService.super_CNetAddr.m_addr._size) + 1);
                }
              }
            }
            iVar41 = this->m_max_automatic_connections;
            if (2 < iVar41) {
              iVar41 = 3;
            }
            iVar24 = 0;
            OpenNetworkConnection
                      (this,&addrConnect,
                       iVar41 + -1 <=
                       local_430 +
                       (int)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&grant,(char *)0x0,local_440,
                       (bool)((byte)((uint)((int)(this->nLocalServices)._M_i &
                                           (undefined4)addrConnect.nServices) >> 0xb) & 1));
          }
LAB_008d3759:
          std::
          _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&reachable_nets._M_h);
        }
        else {
          if (local_408 < lVar28) {
            uVar26 = FastRandomContext::rand64(&rng);
            dVar13 = MakeExponentiallyDistributed(uVar26);
            local_408 = lVar28 + (long)ROUND(dVar13 * 120000000.0 + 0.5);
            local_440 = FEELER;
            local_468._0_4_ = 1;
            goto LAB_008d2b8d;
          }
          iVar24 = 10;
          if (((uVar38 == 8) && (this->m_max_outbound_full_relay == 8)) &&
             ((local_410 < lVar28 &&
              (bVar21 = MaybePickPreferredNetwork(this,&preferred_net), bVar21)))) {
            mVar33 = RandomMixin<FastRandomContext>::rand_exp_duration
                               (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
            local_410 = mVar33.__r + lVar28;
            goto LAB_008d2b7d;
          }
        }
        std::
        _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~_Rb_tree(&outbound_ipv46_peer_netgroups._M_t);
        if (0x10 < addrConnect.super_CService.super_CNetAddr.m_addr._size) {
          free(addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
          addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               (char *)0x0;
        }
        std::
        _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&fixed_seed_networks._M_h);
      }
      if (grant.fHaveGrant == true) {
        CSemaphore::post(grant.sem);
        grant.fHaveGrant = false;
      }
    } while ((iVar24 == 0) || (iVar24 == 10));
  }
  else {
    SVar5 = (this->nLocalServices)._M_i;
    uVar39 = 0;
    while( true ) {
      pcVar6 = (pointer)pbVar37->_M_string_length;
      for (pcVar40 = (pbVar37->_M_dataplus)._M_p; pcVar40 != pcVar6; pcVar40 = pcVar40 + 0x20) {
        CService::CService((CService *)&local_1c8.indirect_contents);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8.indirect_contents)
        ;
        addr.super_CService.super_CNetAddr.m_net = local_1b0;
        addr.super_CService.super_CNetAddr.m_scope_id = uStack_1ac;
        addr.super_CService.port = local_1a8;
        addr.nTime.__d.__r = (duration)100000000;
        addr.nServices = NODE_NONE;
        if (0x10 < local_1b8) {
          free(local_1c8.indirect_contents.indirect);
          local_1c8.indirect_contents.indirect = (char *)0x0;
        }
        addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
             (char *)0x0;
        addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ =
             addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
        OpenNetworkConnection
                  (this,&addr,false,(CSemaphoreGrant *)&addrConnect,*(char **)pcVar40,MANUAL,
                   (bool)((byte)(SVar5 >> 0xb) & 1));
        if (addrConnect.super_CService.super_CNetAddr.m_addr._union.direct[8] == '\x01') {
          CSemaphore::post((CSemaphore *)
                           addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents
                           .indirect);
          addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ =
               addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
        }
        if (uVar39 != 0) {
          uVar35 = 0;
          do {
            bVar16 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
            if (!bVar16) {
              if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
                free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
                addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              goto LAB_008d1c0a;
            }
          } while ((uVar35 < 9) && (uVar35 = uVar35 + 1, uVar35 < uVar39));
        }
        if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
          free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
        }
      }
      bVar16 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
      if (!bVar16) break;
      PerformReconnections(this);
      uVar39 = uVar39 + 1;
    }
  }
LAB_008d1c0a:
  ChaCha20::~ChaCha20(&rng.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadOpenConnections(const std::vector<std::string> connect, Span<const std::string> seed_nodes)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    AssertLockNotHeld(m_reconnections_mutex);
    FastRandomContext rng;
    // Connect to specific addresses
    if (!connect.empty())
    {
        // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
        // peer doesn't support it or immediately disconnects us for another reason.
        const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
        for (int64_t nLoop = 0;; nLoop++)
        {
            for (const std::string& strAddr : connect)
            {
                CAddress addr(CService(), NODE_NONE);
                OpenNetworkConnection(addr, false, {}, strAddr.c_str(), ConnectionType::MANUAL, /*use_v2transport=*/use_v2transport);
                for (int i = 0; i < 10 && i < nLoop; i++)
                {
                    if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                        return;
                }
            }
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;
            PerformReconnections();
        }
    }

    // Initiate network connections
    auto start = GetTime<std::chrono::microseconds>();

    // Minimum time before next feeler connection (in microseconds).
    auto next_feeler = start + rng.rand_exp_duration(FEELER_INTERVAL);
    auto next_extra_block_relay = start + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
    auto next_extra_network_peer{start + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL)};
    const bool dnsseed = gArgs.GetBoolArg("-dnsseed", DEFAULT_DNSSEED);
    bool add_fixed_seeds = gArgs.GetBoolArg("-fixedseeds", DEFAULT_FIXEDSEEDS);
    const bool use_seednodes{gArgs.IsArgSet("-seednode")};

    auto seed_node_timer = NodeClock::now();
    bool add_addr_fetch{addrman.Size() == 0 && !seed_nodes.empty()};
    constexpr std::chrono::seconds ADD_NEXT_SEEDNODE = 10s;

    if (!add_fixed_seeds) {
        LogPrintf("Fixed seeds are disabled\n");
    }

    while (!interruptNet)
    {
        if (add_addr_fetch) {
            add_addr_fetch = false;
            const auto& seed{SpanPopBack(seed_nodes)};
            AddAddrFetch(seed);

            if (addrman.Size() == 0) {
                LogInfo("Empty addrman, adding seednode (%s) to addrfetch\n", seed);
            } else {
                LogInfo("Couldn't connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n", ADD_NEXT_SEEDNODE.count(), seed);
            }
        }

        ProcessAddrFetch();

        if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
            return;

        PerformReconnections();

        CSemaphoreGrant grant(*semOutbound);
        if (interruptNet)
            return;

        const std::unordered_set<Network> fixed_seed_networks{GetReachableEmptyNetworks()};
        if (add_fixed_seeds && !fixed_seed_networks.empty()) {
            // When the node starts with an empty peers.dat, there are a few other sources of peers before
            // we fallback on to fixed seeds: -dnsseed, -seednode, -addnode
            // If none of those are available, we fallback on to fixed seeds immediately, else we allow
            // 60 seconds for any of those sources to populate addrman.
            bool add_fixed_seeds_now = false;
            // It is cheapest to check if enough time has passed first.
            if (GetTime<std::chrono::seconds>() > start + std::chrono::minutes{1}) {
                add_fixed_seeds_now = true;
                LogPrintf("Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n");
            }

            // Perform cheap checks before locking a mutex.
            else if (!dnsseed && !use_seednodes) {
                LOCK(m_added_nodes_mutex);
                if (m_added_node_params.empty()) {
                    add_fixed_seeds_now = true;
                    LogPrintf("Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n");
                }
            }

            if (add_fixed_seeds_now) {
                std::vector<CAddress> seed_addrs{ConvertSeeds(m_params.FixedSeeds())};
                // We will not make outgoing connections to peers that are unreachable
                // (e.g. because of -onlynet configuration).
                // Therefore, we do not add them to addrman in the first place.
                // In case previously unreachable networks become reachable
                // (e.g. in case of -onlynet changes by the user), fixed seeds will
                // be loaded only for networks for which we have no addresses.
                seed_addrs.erase(std::remove_if(seed_addrs.begin(), seed_addrs.end(),
                                                [&fixed_seed_networks](const CAddress& addr) { return fixed_seed_networks.count(addr.GetNetwork()) == 0; }),
                                 seed_addrs.end());
                CNetAddr local;
                local.SetInternal("fixedseeds");
                addrman.Add(seed_addrs, local);
                add_fixed_seeds = false;
                LogPrintf("Added %d fixed seeds from reachable networks.\n", seed_addrs.size());
            }
        }

        //
        // Choose an address to connect to based on most recently seen
        //
        CAddress addrConnect;

        // Only connect out to one peer per ipv4/ipv6 network group (/16 for IPv4).
        int nOutboundFullRelay = 0;
        int nOutboundBlockRelay = 0;
        int outbound_privacy_network_peers = 0;
        std::set<std::vector<unsigned char>> outbound_ipv46_peer_netgroups;

        {
            LOCK(m_nodes_mutex);
            for (const CNode* pnode : m_nodes) {
                if (pnode->IsFullOutboundConn()) nOutboundFullRelay++;
                if (pnode->IsBlockOnlyConn()) nOutboundBlockRelay++;

                // Make sure our persistent outbound slots to ipv4/ipv6 peers belong to different netgroups.
                switch (pnode->m_conn_type) {
                    // We currently don't take inbound connections into account. Since they are
                    // free to make, an attacker could make them to prevent us from connecting to
                    // certain peers.
                    case ConnectionType::INBOUND:
                    // Short-lived outbound connections should not affect how we select outbound
                    // peers from addrman.
                    case ConnectionType::ADDR_FETCH:
                    case ConnectionType::FEELER:
                        break;
                    case ConnectionType::MANUAL:
                    case ConnectionType::OUTBOUND_FULL_RELAY:
                    case ConnectionType::BLOCK_RELAY:
                        const CAddress address{pnode->addr};
                        if (address.IsTor() || address.IsI2P() || address.IsCJDNS()) {
                            // Since our addrman-groups for these networks are
                            // random, without relation to the route we
                            // take to connect to these peers or to the
                            // difficulty in obtaining addresses with diverse
                            // groups, we don't worry about diversity with
                            // respect to our addrman groups when connecting to
                            // these networks.
                            ++outbound_privacy_network_peers;
                        } else {
                            outbound_ipv46_peer_netgroups.insert(m_netgroupman.GetGroup(address));
                        }
                } // no default case, so the compiler can warn about missing cases
            }
        }

        if (!seed_nodes.empty() && nOutboundFullRelay < SEED_OUTBOUND_CONNECTION_THRESHOLD) {
            if (NodeClock::now() > seed_node_timer + ADD_NEXT_SEEDNODE) {
                seed_node_timer = NodeClock::now();
                add_addr_fetch = true;
            }
        }

        ConnectionType conn_type = ConnectionType::OUTBOUND_FULL_RELAY;
        auto now = GetTime<std::chrono::microseconds>();
        bool anchor = false;
        bool fFeeler = false;
        std::optional<Network> preferred_net;

        // Determine what type of connection to open. Opening
        // BLOCK_RELAY connections to addresses from anchors.dat gets the highest
        // priority. Then we open OUTBOUND_FULL_RELAY priority until we
        // meet our full-relay capacity. Then we open BLOCK_RELAY connection
        // until we hit our block-relay-only peer limit.
        // GetTryNewOutboundPeer() gets set when a stale tip is detected, so we
        // try opening an additional OUTBOUND_FULL_RELAY connection. If none of
        // these conditions are met, check to see if it's time to try an extra
        // block-relay-only peer (to confirm our tip is current, see below) or the next_feeler
        // timer to decide if we should open a FEELER.

        if (!m_anchors.empty() && (nOutboundBlockRelay < m_max_outbound_block_relay)) {
            conn_type = ConnectionType::BLOCK_RELAY;
            anchor = true;
        } else if (nOutboundFullRelay < m_max_outbound_full_relay) {
            // OUTBOUND_FULL_RELAY
        } else if (nOutboundBlockRelay < m_max_outbound_block_relay) {
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (GetTryNewOutboundPeer()) {
            // OUTBOUND_FULL_RELAY
        } else if (now > next_extra_block_relay && m_start_extra_block_relay_peers) {
            // Periodically connect to a peer (using regular outbound selection
            // methodology from addrman) and stay connected long enough to sync
            // headers, but not much else.
            //
            // Then disconnect the peer, if we haven't learned anything new.
            //
            // The idea is to make eclipse attacks very difficult to pull off,
            // because every few minutes we're finding a new peer to learn headers
            // from.
            //
            // This is similar to the logic for trying extra outbound (full-relay)
            // peers, except:
            // - we do this all the time on an exponential timer, rather than just when
            //   our tip is stale
            // - we potentially disconnect our next-youngest block-relay-only peer, if our
            //   newest block-relay-only peer delivers a block more recently.
            //   See the eviction logic in net_processing.cpp.
            //
            // Because we can promote these connections to block-relay-only
            // connections, they do not get their own ConnectionType enum
            // (similar to how we deal with extra outbound peers).
            next_extra_block_relay = now + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (now > next_feeler) {
            next_feeler = now + rng.rand_exp_duration(FEELER_INTERVAL);
            conn_type = ConnectionType::FEELER;
            fFeeler = true;
        } else if (nOutboundFullRelay == m_max_outbound_full_relay &&
                   m_max_outbound_full_relay == MAX_OUTBOUND_FULL_RELAY_CONNECTIONS &&
                   now > next_extra_network_peer &&
                   MaybePickPreferredNetwork(preferred_net)) {
            // Full outbound connection management: Attempt to get at least one
            // outbound peer from each reachable network by making extra connections
            // and then protecting "only" peers from a network during outbound eviction.
            // This is not attempted if the user changed -maxconnections to a value
            // so low that less than MAX_OUTBOUND_FULL_RELAY_CONNECTIONS are made,
            // to prevent interactions with otherwise protected outbound peers.
            next_extra_network_peer = now + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL);
        } else {
            // skip to next iteration of while loop
            continue;
        }

        addrman.ResolveCollisions();

        const auto current_time{NodeClock::now()};
        int nTries = 0;
        const auto reachable_nets{g_reachable_nets.All()};

        while (!interruptNet)
        {
            if (anchor && !m_anchors.empty()) {
                const CAddress addr = m_anchors.back();
                m_anchors.pop_back();
                if (!addr.IsValid() || IsLocal(addr) || !g_reachable_nets.Contains(addr) ||
                    !m_msgproc->HasAllDesirableServiceFlags(addr.nServices) ||
                    outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) continue;
                addrConnect = addr;
                LogDebug(BCLog::NET, "Trying to make an anchor connection to %s\n", addrConnect.ToStringAddrPort());
                break;
            }

            // If we didn't find an appropriate destination after trying 100 addresses fetched from addrman,
            // stop this loop, and let the outer loop run again (which sleeps, adds seed nodes, recalculates
            // already-connected network ranges, ...) before trying new addrman addresses.
            nTries++;
            if (nTries > 100)
                break;

            CAddress addr;
            NodeSeconds addr_last_try{0s};

            if (fFeeler) {
                // First, try to get a tried table collision address. This returns
                // an empty (invalid) address if there are no collisions to try.
                std::tie(addr, addr_last_try) = addrman.SelectTriedCollision();

                if (!addr.IsValid()) {
                    // No tried table collisions. Select a new table address
                    // for our feeler.
                    std::tie(addr, addr_last_try) = addrman.Select(true, reachable_nets);
                } else if (AlreadyConnectedToAddress(addr)) {
                    // If test-before-evict logic would have us connect to a
                    // peer that we're already connected to, just mark that
                    // address as Good(). We won't be able to initiate the
                    // connection anyway, so this avoids inadvertently evicting
                    // a currently-connected peer.
                    addrman.Good(addr);
                    // Select a new table address for our feeler instead.
                    std::tie(addr, addr_last_try) = addrman.Select(true, reachable_nets);
                }
            } else {
                // Not a feeler
                // If preferred_net has a value set, pick an extra outbound
                // peer from that network. The eviction logic in net_processing
                // ensures that a peer from another network will be evicted.
                std::tie(addr, addr_last_try) = preferred_net.has_value()
                    ? addrman.Select(false, {*preferred_net})
                    : addrman.Select(false, reachable_nets);
            }

            // Require outbound IPv4/IPv6 connections, other than feelers, to be to distinct network groups
            if (!fFeeler && outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) {
                continue;
            }

            // if we selected an invalid or local address, restart
            if (!addr.IsValid() || IsLocal(addr)) {
                break;
            }

            if (!g_reachable_nets.Contains(addr)) {
                continue;
            }

            // only consider very recently tried nodes after 30 failed attempts
            if (current_time - addr_last_try < 10min && nTries < 30) {
                continue;
            }

            // for non-feelers, require all the services we'll want,
            // for feelers, only require they be a full node (only because most
            // SPV clients don't have a good address DB available)
            if (!fFeeler && !m_msgproc->HasAllDesirableServiceFlags(addr.nServices)) {
                continue;
            } else if (fFeeler && !MayHaveUsefulAddressDB(addr.nServices)) {
                continue;
            }

            // Do not connect to bad ports, unless 50 invalid addresses have been selected already.
            if (nTries < 50 && (addr.IsIPv4() || addr.IsIPv6()) && IsBadPort(addr.GetPort())) {
                continue;
            }

            // Do not make automatic outbound connections to addnode peers, to
            // not use our limited outbound slots for them and to ensure
            // addnode connections benefit from their intended protections.
            if (AddedNodesContain(addr)) {
                LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n",
                              preferred_net.has_value() ? "network-specific " : "",
                              ConnectionTypeAsString(conn_type), GetNetworkName(addr.GetNetwork()),
                              fLogIPs ? strprintf(": %s", addr.ToStringAddrPort()) : "");
                continue;
            }

            addrConnect = addr;
            break;
        }

        if (addrConnect.IsValid()) {
            if (fFeeler) {
                // Add small amount of random noise before connection to avoid synchronization.
                if (!interruptNet.sleep_for(rng.rand_uniform_duration<CThreadInterrupt::Clock>(FEELER_SLEEP_WINDOW))) {
                    return;
                }
                LogDebug(BCLog::NET, "Making feeler connection to %s\n", addrConnect.ToStringAddrPort());
            }

            if (preferred_net != std::nullopt) LogDebug(BCLog::NET, "Making network specific connection to %s on %s.\n", addrConnect.ToStringAddrPort(), GetNetworkName(preferred_net.value()));

            // Record addrman failure attempts when node has at least 2 persistent outbound connections to peers with
            // different netgroups in ipv4/ipv6 networks + all peers in Tor/I2P/CJDNS networks.
            // Don't record addrman failure attempts when node is offline. This can be identified since all local
            // network connections (if any) belong in the same netgroup, and the size of `outbound_ipv46_peer_netgroups` would only be 1.
            const bool count_failures{((int)outbound_ipv46_peer_netgroups.size() + outbound_privacy_network_peers) >= std::min(m_max_automatic_connections - 1, 2)};
            // Use BIP324 transport when both us and them have NODE_V2_P2P set.
            const bool use_v2transport(addrConnect.nServices & GetLocalServices() & NODE_P2P_V2);
            OpenNetworkConnection(addrConnect, count_failures, std::move(grant), /*strDest=*/nullptr, conn_type, use_v2transport);
        }
    }
}